

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int pager_release_page(Pager *pPager,Page *pPage)

{
  int in_EAX;
  sxi32 sVar1;
  
  if ((pPage->flags & 2) == 0) {
    if ((pPager->xPageUnpin != (_func_void_void_ptr *)0x0) && (pPage->pUserData != (void *)0x0)) {
      (*pPager->xPageUnpin)(pPage->pUserData);
    }
    pPage->pUserData = (void *)0x0;
    sVar1 = SyMemBackendPoolFree(pPager->pAllocator,pPage);
    return sVar1;
  }
  return in_EAX;
}

Assistant:

static int pager_release_page(Pager *pPager,Page *pPage)
{
	int rc = UNQLITE_OK;
	if( !(pPage->flags & PAGE_DIRTY)){
		/* Invoke the unpin callback if available */
		if( pPager->xPageUnpin && pPage->pUserData ){
			pPager->xPageUnpin(pPage->pUserData);
		}
		pPage->pUserData = 0;
		SyMemBackendPoolFree(pPager->pAllocator,pPage);
	}else{
		/* Dirty page, it will be released later when a dirty commit
		 * or the final commit have been applied.
		 */
		rc = UNQLITE_LOCKED;
	}
	return rc;
}